

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

void __thiscall VcprojGenerator::~VcprojGenerator(VcprojGenerator *this)

{
  undefined8 *in_RDI;
  VCProjectSingleConfig *this_00;
  
  *in_RDI = &PTR_fixPathForFile_003bada8;
  this_00 = (VCProjectSingleConfig *)in_RDI[0x33];
  if (this_00 != (VCProjectSingleConfig *)0x0) {
    (*(code *)(((this_00->Name).d.d)->super_QArrayData).alloc)();
  }
  QList<VcprojGenerator_*>::~QList((QList<VcprojGenerator_*> *)0x2871d1);
  VCProjectSingleConfig::~VCProjectSingleConfig(this_00);
  QString::~QString((QString *)0x2871f1);
  QHash<QString,_QString>::~QHash((QHash<QString,_QString> *)this_00);
  QHash<QString,_QList<QString>_>::~QHash((QHash<QString,_QList<QString>_> *)this_00);
  QString::~QString((QString *)0x287221);
  QString::~QString((QString *)0x287231);
  QString::~QString((QString *)0x287241);
  QString::~QString((QString *)0x287251);
  QString::~QString((QString *)0x287261);
  Win32MakefileGenerator::~Win32MakefileGenerator((Win32MakefileGenerator *)0x28726a);
  return;
}

Assistant:

VcprojGenerator::~VcprojGenerator()
{
    delete projectWriter;
}